

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_buffer_init(nk_buffer *b,nk_allocator *a,nk_size initial_size)

{
  undefined8 *puVar1;
  nk_plugin_alloc p_Var2;
  void *pvVar3;
  ulong __n;
  
  if (b == (nk_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x1f64,
                  "void nk_buffer_init(struct nk_buffer *, const struct nk_allocator *, nk_size)");
  }
  if (a != (nk_allocator *)0x0) {
    if (initial_size != 0) {
      __n = (ulong)b & 3;
      if (__n == 0) {
        b->needed = 0;
        b->calls = 0;
        *(undefined8 *)&b->grow_factor = 0;
        b->allocated = 0;
        (b->memory).ptr = (void *)0x0;
        (b->memory).size = 0;
        (b->pool).free = (nk_plugin_free)0x0;
        *(undefined8 *)&b->type = 0;
        (b->pool).userdata.ptr = (void *)0x0;
        (b->pool).alloc = (nk_plugin_alloc)0x0;
        *(undefined8 *)(b->marker + 1) = 0;
        b->marker[1].offset = 0;
        *(undefined8 *)b->marker = 0;
        b->marker[0].offset = 0;
        b->size = 0;
      }
      else {
        memset(b,0,4 - __n);
        puVar1 = (undefined8 *)((long)b + (4 - __n));
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        puVar1[4] = 0;
        puVar1[5] = 0;
        puVar1[6] = 0;
        puVar1[7] = 0;
        puVar1[8] = 0;
        puVar1[9] = 0;
        puVar1[10] = 0;
        puVar1[0xb] = 0;
        puVar1[0xc] = 0;
        puVar1[0xd] = 0;
        *(undefined4 *)(puVar1 + 0xe) = 0;
        memset((void *)((long)puVar1 + 0x74),0,__n);
      }
      b->type = NK_BUFFER_DYNAMIC;
      pvVar3 = (*a->alloc)(a->userdata,(void *)0x0,initial_size);
      (b->memory).ptr = pvVar3;
      (b->memory).size = initial_size;
      b->size = initial_size;
      b->grow_factor = 2.0;
      p_Var2 = a->alloc;
      (b->pool).userdata = a->userdata;
      (b->pool).alloc = p_Var2;
      (b->pool).free = a->free;
      return;
    }
    __assert_fail("initial_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x1f66,
                  "void nk_buffer_init(struct nk_buffer *, const struct nk_allocator *, nk_size)");
  }
  __assert_fail("a",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x1f65,
                "void nk_buffer_init(struct nk_buffer *, const struct nk_allocator *, nk_size)");
}

Assistant:

NK_API void
nk_buffer_init(struct nk_buffer *b, const struct nk_allocator *a,
    nk_size initial_size)
{
    NK_ASSERT(b);
    NK_ASSERT(a);
    NK_ASSERT(initial_size);
    if (!b || !a || !initial_size) return;

    nk_zero(b, sizeof(*b));
    b->type = NK_BUFFER_DYNAMIC;
    b->memory.ptr = a->alloc(a->userdata,0, initial_size);
    b->memory.size = initial_size;
    b->size = initial_size;
    b->grow_factor = 2.0f;
    b->pool = *a;
}